

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O1

void deSingleton_selfTest(void)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  deBool dVar5;
  deMemPool *pdVar6;
  deThread dVar7;
  int iVar8;
  dePoolArray *arr;
  int size;
  uint uVar9;
  undefined4 local_44;
  long local_40;
  deMemPool *local_38;
  
  local_40 = 0;
  do {
    iVar1 = (&DAT_00105828)[local_40 * 3];
    if (0 < iVar1) {
      uVar2 = (&DAT_00105820)[local_40 * 3];
      uVar3 = (&DAT_00105824)[local_40 * 3];
      iVar8 = 0;
      do {
        local_44 = uVar3;
        pdVar6 = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
        arr = (dePoolArray *)0x0;
        if (pdVar6 != (deMemPool *)0x0) {
          arr = dePoolArray_create(pdVar6,8);
        }
        s_testSingleton = DE_SINGLETON_STATE_NOT_INITIALIZED;
        s_testSingletonInitCount = 0;
        s_testSingletonInitialized = '\0';
        s_singletonInitLock = 0;
        uVar9 = uVar2;
        local_38 = pdVar6;
        if ((int)uVar2 < 1) {
          s_singletonInitLock = 1;
        }
        else {
          do {
            dVar7 = deThread_create(singletonTestThread,&local_44,(deThreadAttributes *)0x0);
            if (dVar7 == 0) {
              deAssertFail("thread",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                           ,0x27e);
            }
            size = arr->numElements + 1;
            if ((arr->capacity < size) && (dVar5 = dePoolArray_reserve(arr,size), dVar5 == 0)) {
              deAssertFail("deThreadArray_pushBack(threads, thread)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                           ,0x27f);
            }
            else {
              uVar4 = arr->numElements;
              arr->numElements = uVar4 + 1;
              *(deThread *)((long)arr->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 8) =
                   dVar7;
            }
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          s_singletonInitLock = 1;
          if (0 < (int)uVar2) {
            uVar9 = 0;
            do {
              dVar7 = *(deThread *)((long)arr->pageTable[uVar9 >> 4] + (ulong)(uVar9 & 0xf) * 8);
              dVar5 = deThread_join(dVar7);
              if (dVar5 == 0) {
                deAssertFail("deThread_join(thread)",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                             ,0x28a);
              }
              deThread_destroy(dVar7);
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
        }
        if (s_testSingletonInitialized == '\0') {
          deAssertFail("s_testSingletonInitialized",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                       ,0x28f);
        }
        pdVar6 = local_38;
        if (s_testSingletonInitCount != 1) {
          deAssertFail("s_testSingletonInitCount == 1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                       ,0x290);
        }
        deMemPool_destroy(pdVar6);
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar1);
    }
    local_40 = local_40 + 1;
  } while (local_40 != 7);
  return;
}

Assistant:

void deSingleton_selfTest (void)
{
	const struct
	{
		int		numThreads;
		int		initTimeMs;
		int		repeatCount;
	} cases[] =
	{
	/*	#threads	time	#repeat	*/
		{ 1,		-1,		5	},
		{ 1,		1,		5	},
		{ 2,		-1,		20	},
		{ 2,		1,		20	},
		{ 4,		-1,		20	},
		{ 4,		1,		20	},
		{ 4,		5,		20	}
	};
	int caseNdx;

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		int		numThreads		= cases[caseNdx].numThreads;
		int		initTimeMs		= cases[caseNdx].initTimeMs;
		int		repeatCount		= cases[caseNdx].repeatCount;
		int		subCaseNdx;

		for (subCaseNdx = 0; subCaseNdx < repeatCount; subCaseNdx++)
			runSingletonThreadedTest(numThreads, initTimeMs);
	}
}